

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_io_error.cpp
# Opt level: O1

int main(void)

{
  undefined8 uVar1;
  char cVar2;
  int iVar3;
  undefined4 extraout_var;
  int extraout_EDX;
  uint uVar4;
  undefined1 auVar5 [12];
  error e;
  status_code_storage<system_error2::detail::erased<long,_true>_> local_88;
  long *local_78;
  undefined4 local_70;
  char *local_68;
  char *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  code *local_10;
  
  local_88 = (status_code_storage<system_error2::detail::erased<long,_true>_>)open_resource();
  (**(local_88.super_status_code<void>._domain._domain)->_vptr_status_code_domain)
            (&local_38,local_88.super_status_code<void>._domain._domain);
  uVar1 = local_38;
  if (local_88.super_status_code<void>._domain == (status_code_domain *)0x0) {
    local_68 = "(empty)";
    local_60 = "";
    local_58 = 0;
    uStack_50 = 0;
    local_48 = 0;
    local_40 = system_error2::status_code_domain::string_ref::_checking_string_thunk;
  }
  else {
    (*(local_88.super_status_code<void>._domain)->_vptr_status_code_domain[5])
              (&local_68,local_88.super_status_code<void>._domain,&local_88);
  }
  printf("Returned error has a code domain of \'%s\', a message of \'%s\'\n",uVar1,local_68);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_68,0,2);
  }
  if (local_10 != (code *)0x0) {
    (*local_10)(&local_38,0,2);
  }
  local_78 = &system_error2::generic_code_domain;
  local_70 = 1;
  if (local_88.super_status_code<void>._domain != (status_code_domain *)0x0) {
    iVar3 = (*(local_88.super_status_code<void>._domain)->_vptr_status_code_domain[3])
                      (local_88.super_status_code<void>._domain,&local_88,&local_78);
    uVar4 = 1;
    if ((char)iVar3 != '\0') goto LAB_00102587;
    cVar2 = (**(code **)(*local_78 + 0x18))(local_78,&local_78,&local_88);
    if (cVar2 != '\0') goto LAB_00102587;
    auVar5 = (**(code **)(*local_78 + 0x20))();
    local_38 = auVar5._0_8_;
    uStack_30 = CONCAT44(uStack_30._4_4_,auVar5._8_4_);
    if (auVar5._8_4_ != -1) {
      iVar3 = (*(local_88.super_status_code<void>._domain)->_vptr_status_code_domain[3])
                        (local_88.super_status_code<void>._domain,&local_88,&local_38);
      if ((char)iVar3 != '\0') goto LAB_00102587;
    }
    iVar3 = (*(local_88.super_status_code<void>._domain)->_vptr_status_code_domain[4])();
    local_68 = (char *)CONCAT44(extraout_var,iVar3);
    local_60 = (char *)CONCAT44(local_60._4_4_,extraout_EDX);
    if (extraout_EDX != -1) {
      cVar2 = (**(code **)(*local_78 + 0x18))(local_78,&local_78,&local_68);
      if (cVar2 != '\0') goto LAB_00102587;
    }
  }
  uVar4 = (uint)(local_78 == (long *)0x0 &&
                local_88.super_status_code<void>._domain == (status_code_domain *)0x0);
LAB_00102587:
  printf("\nAnd semantically comparing it to \'errc::operation_not_permitted\' = %d\n",(ulong)uVar4)
  ;
  if (local_88.super_status_code<void>._domain != (status_code_domain *)0x0) {
    local_38 = 8;
    uStack_30 = 0x10;
    local_28 = 8;
    (*(local_88.super_status_code<void>._domain)->_vptr_status_code_domain[8])
              (local_88.super_status_code<void>._domain,&local_88);
  }
  return 0;
}

Assistant:

int main(void)
{
  error e = open_resource();
  // A quick demonstration that the indirection works as indicated
  printf("Returned error has a code domain of '%s', a message of '%s'\n", e.domain().name().c_str(), e.message().c_str());
  printf("\nAnd semantically comparing it to 'errc::operation_not_permitted' = %d\n", e == errc::operation_not_permitted);
}